

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.cpp
# Opt level: O0

void __thiscall Logger::flush(Logger *this)

{
  lock_guard<std::mutex> local_18;
  lock_guard<std::mutex> lck;
  Logger *this_local;
  
  lck._M_device = (mutex_type *)this;
  std::lock_guard<std::mutex>::lock_guard(&local_18,&this->l_mutex);
  fflush((FILE *)this->l_fp);
  std::lock_guard<std::mutex>::~lock_guard(&local_18);
  return;
}

Assistant:

void Logger::flush(void)
{
    lock_guard<mutex> lck (l_mutex);
    fflush(l_fp);
}